

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O2

QRectF * __thiscall
QGraphicsItem::mapRectToScene(QRectF *__return_storage_ptr__,QGraphicsItem *this,QRectF *rect)

{
  QGraphicsItemPrivate *pQVar1;
  double dVar2;
  double dVar3;
  qreal qVar4;
  bool bVar5;
  
  bVar5 = QGraphicsItemPrivate::hasTranslateOnlySceneTransform((this->d_ptr).d);
  pQVar1 = (this->d_ptr).d;
  if (bVar5) {
    dVar2 = (pQVar1->sceneTransform).m_matrix[2][1];
    dVar3 = rect->yp;
    __return_storage_ptr__->xp = rect->xp + (pQVar1->sceneTransform).m_matrix[2][0];
    __return_storage_ptr__->yp = dVar3 + dVar2;
    qVar4 = rect->h;
    __return_storage_ptr__->w = rect->w;
    __return_storage_ptr__->h = qVar4;
  }
  else {
    QTransform::mapRect((QRectF *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

QRectF QGraphicsItem::mapRectToScene(const QRectF &rect) const
{
    if (d_ptr->hasTranslateOnlySceneTransform())
        return rect.translated(d_ptr->sceneTransform.dx(), d_ptr->sceneTransform.dy());
    return d_ptr->sceneTransform.mapRect(rect);
}